

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall
ON_BoundingBox::GetFarPoint
          (ON_BoundingBox *this,ON_BoundingBox *other_box,ON_3dPoint *this_point,
          ON_3dPoint *other_point)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 local_58 [8];
  ON_Interval Io;
  ON_Interval It;
  int i;
  ON_3dPoint *other_point_local;
  ON_3dPoint *this_point_local;
  ON_BoundingBox *other_box_local;
  ON_BoundingBox *this_local;
  
  bVar1 = IsValid(this);
  if ((bVar1) && (bVar1 = IsValid(other_box), bVar1)) {
    for (It.m_t[1]._4_4_ = 0; It.m_t[1]._4_4_ < 3; It.m_t[1]._4_4_ = It.m_t[1]._4_4_ + 1) {
      dVar3 = ON_3dPoint::operator[](&this->m_min,It.m_t[1]._4_4_);
      dVar4 = ON_3dPoint::operator[](&this->m_max,It.m_t[1]._4_4_);
      ON_Interval::ON_Interval((ON_Interval *)(Io.m_t + 1),dVar3,dVar4);
      dVar3 = ON_3dPoint::operator[](&other_box->m_min,It.m_t[1]._4_4_);
      dVar4 = ON_3dPoint::operator[](&other_box->m_max,It.m_t[1]._4_4_);
      ON_Interval::ON_Interval((ON_Interval *)local_58,dVar3,dVar4);
      bVar1 = ON_Interval::Includes((ON_Interval *)(Io.m_t + 1),(ON_Interval *)local_58,false);
      if ((bVar1) ||
         (bVar1 = ON_Interval::Includes((ON_Interval *)local_58,(ON_Interval *)(Io.m_t + 1),false),
         bVar1)) {
        dVar3 = ON_3dPoint::operator[](&this->m_max,It.m_t[1]._4_4_);
        dVar4 = ON_3dPoint::operator[](&other_box->m_min,It.m_t[1]._4_4_);
        dVar5 = ON_3dPoint::operator[](&other_box->m_max,It.m_t[1]._4_4_);
        dVar6 = ON_3dPoint::operator[](&this->m_min,It.m_t[1]._4_4_);
        if (dVar3 - dVar4 <= dVar5 - dVar6) {
          dVar3 = ON_3dPoint::operator[](&this->m_min,It.m_t[1]._4_4_);
          pdVar2 = ON_3dPoint::operator[](this_point,It.m_t[1]._4_4_);
          *pdVar2 = dVar3;
          dVar3 = ON_3dPoint::operator[](&other_box->m_max,It.m_t[1]._4_4_);
          pdVar2 = ON_3dPoint::operator[](other_point,It.m_t[1]._4_4_);
          *pdVar2 = dVar3;
        }
        else {
          dVar3 = ON_3dPoint::operator[](&this->m_max,It.m_t[1]._4_4_);
          pdVar2 = ON_3dPoint::operator[](this_point,It.m_t[1]._4_4_);
          *pdVar2 = dVar3;
          dVar3 = ON_3dPoint::operator[](&other_box->m_min,It.m_t[1]._4_4_);
          pdVar2 = ON_3dPoint::operator[](other_point,It.m_t[1]._4_4_);
          *pdVar2 = dVar3;
        }
      }
      else {
        dVar3 = ON_3dPoint::operator[](&this->m_min,It.m_t[1]._4_4_);
        dVar4 = ON_3dPoint::operator[](&other_box->m_min,It.m_t[1]._4_4_);
        if (dVar4 <= dVar3) {
          dVar3 = ON_3dPoint::operator[](&other_box->m_min,It.m_t[1]._4_4_);
          pdVar2 = ON_3dPoint::operator[](other_point,It.m_t[1]._4_4_);
          *pdVar2 = dVar3;
        }
        else {
          dVar3 = ON_3dPoint::operator[](&this->m_min,It.m_t[1]._4_4_);
          pdVar2 = ON_3dPoint::operator[](this_point,It.m_t[1]._4_4_);
          *pdVar2 = dVar3;
        }
        dVar3 = ON_3dPoint::operator[](&this->m_max,It.m_t[1]._4_4_);
        dVar4 = ON_3dPoint::operator[](&other_box->m_max,It.m_t[1]._4_4_);
        if (dVar3 <= dVar4) {
          dVar3 = ON_3dPoint::operator[](&other_box->m_max,It.m_t[1]._4_4_);
          pdVar2 = ON_3dPoint::operator[](other_point,It.m_t[1]._4_4_);
          *pdVar2 = dVar3;
        }
        else {
          dVar3 = ON_3dPoint::operator[](&this->m_max,It.m_t[1]._4_4_);
          pdVar2 = ON_3dPoint::operator[](this_point,It.m_t[1]._4_4_);
          *pdVar2 = dVar3;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BoundingBox::GetFarPoint( 
       const ON_BoundingBox& other_box, // "other" bounding box
       ON_3dPoint& this_point, // point on "this" box that is farthest from "other" box point
       ON_3dPoint& other_point // point on "other" box that is farthest from "this" box point
       )  const
{
	if(!IsValid() || !other_box.IsValid())
		return false;
	for(int i=0; i<3; i++){
		ON_Interval It(m_min[i], m_max[i]);
		ON_Interval Io(other_box.m_min[i], other_box.m_max[i]);
		if( It.Includes(Io) || Io.Includes(It)){
			if( m_max[i] - other_box.m_min[i] > other_box.m_max[i] - m_min[i]){
				this_point[i] = m_max[i];
				other_point[i] = other_box.m_min[i];
			} else {
				this_point[i] = m_min[i];
				other_point[i] = other_box.m_max[i];
			}
		} else {
			if( m_min[i]< other_box.m_min[i]){
				this_point[i]=m_min[i];
			} else {
				other_point[i] = other_box.m_min[i];
			}
			if( m_max[i]> other_box.m_max[i]){
				this_point[i]=m_max[i];
			} else {
				other_point[i] = other_box.m_max[i];
			}
		}
	}
	return true;
}